

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.2.13.10.hpp
# Opt level: O0

ostream * Catch::operator<<(ostream *os,Version *version)

{
  ostream *poVar1;
  uint *in_RSI;
  ostream *in_RDI;
  
  poVar1 = (ostream *)std::ostream::operator<<(in_RDI,*in_RSI);
  poVar1 = std::operator<<(poVar1,'.');
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_RSI[1]);
  poVar1 = std::operator<<(poVar1,'.');
  std::ostream::operator<<(poVar1,in_RSI[2]);
  if (**(char **)(in_RSI + 4) != '\0') {
    poVar1 = std::operator<<(in_RDI,'-');
    poVar1 = std::operator<<(poVar1,*(char **)(in_RSI + 4));
    poVar1 = std::operator<<(poVar1,'.');
    std::ostream::operator<<(poVar1,in_RSI[6]);
  }
  return (ostream *)in_RDI;
}

Assistant:

std::ostream& operator << ( std::ostream& os, Version const& version ) {
        os  << version.majorVersion << '.'
            << version.minorVersion << '.'
            << version.patchNumber;
        // branchName is never null -> 0th char is \0 if it is empty
        if (version.branchName[0]) {
            os << '-' << version.branchName
               << '.' << version.buildNumber;
        }
        return os;
    }